

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall
JsonParser_deserialize_string_Test::~JsonParser_deserialize_string_Test
          (JsonParser_deserialize_string_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonParser, deserialize_string) {
	json_parser parser;

	EXPECT_EQ(parser.deserialize(u8R"json("text")json"sv), u8"text");

	object obj;
	std::u8string_view u8text = u8R"json("text")json"sv;
	EXPECT_TRUE(deserialize_json(obj, u8text));
	EXPECT_EQ(obj, u8"text"sv);
	EXPECT_TRUE(u8text.empty());

	std::u16string_view u16text = uR"json("text")json"sv;
	EXPECT_TRUE(deserialize_json(obj, u16text));
	EXPECT_EQ(obj, u8"text"sv);
	EXPECT_TRUE(u16text.empty());

	std::u32string_view u32text = UR"json("text")json"sv;
	EXPECT_TRUE(deserialize_json(obj, u32text));
	EXPECT_EQ(obj, u8"text"sv);
	EXPECT_TRUE(u32text.empty());
}